

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O2

wchar_t object_value_real(object *obj,wchar_t qty)

{
  obj_property *poVar1;
  byte bVar2;
  short sVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  char *pcVar6;
  _Bool *p_Var7;
  object_kind *poVar8;
  _Bool _Var9;
  _Bool _Var10;
  int iVar11;
  int iVar12;
  wchar_t wVar13;
  int iVar14;
  obj_property *poVar15;
  char *pcVar16;
  char *pcVar17;
  angband_constants *paVar18;
  wchar_t *pwVar19;
  ulong uVar20;
  long lVar21;
  wchar_t wVar22;
  char **ppcVar23;
  ulong uVar24;
  ulong uVar25;
  int local_54;
  
  _Var9 = tval_has_variable_power(obj);
  if (_Var9) {
    wVar22 = obj->kind->cost;
    for (uVar24 = 1; uVar24 < z_info->property_max; uVar24 = uVar24 + 1) {
      wVar13 = obj_properties[uVar24].type;
      if (7 < (uint)(wVar13 + L'\xffffffff')) goto switchD_001a1d5b_default;
      poVar1 = obj_properties + uVar24;
      wVar4 = obj_properties[uVar24].index;
      switch(wVar13) {
      default:
        if (obj->modifiers[wVar4] == 0) break;
LAB_001a1d42:
        switch(wVar13) {
        case L'\x01':
        case L'\x02':
          iVar14 = (int)obj->modifiers[wVar4];
          iVar11 = -iVar14;
          if (0 < iVar14) {
            iVar11 = iVar14;
          }
          iVar14 = (iVar11 * poVar1->price_square + poVar1->price_linear) * iVar14;
          wVar22 = wVar22 + poVar1->price_constant;
          goto LAB_001a22ab;
        case L'\x03':
        case L'\x05':
          goto switchD_001a1d5b_caseD_3;
        case L'\x04':
          goto switchD_001a1d5b_caseD_4;
        case L'\x06':
switchD_001a1d5b_caseD_6:
          lVar21 = 0x20;
          paVar18 = z_info;
          for (uVar25 = 0; uVar25 < paVar18->brand_max; uVar25 = uVar25 + 1) {
            if ((obj->brands[uVar25] == true) &&
               (poVar15 = brand_property((wchar_t)uVar25), poVar1 == poVar15)) {
              iVar14 = *(int *)((long)&brands->code + lVar21);
              _Var9 = tval_is_ammo(obj);
              iVar11 = -iVar14;
              if (0 < iVar14) {
                iVar11 = iVar14;
              }
              iVar14 = ((iVar11 * poVar1->price_square + poVar1->price_linear) * iVar14 +
                       poVar1->price_constant) / (int)((uint)_Var9 * 9 + 1);
              _Var10 = tval_is_melee_weapon(obj);
              if (_Var9 || _Var10) {
                iVar14 = (int)(iVar14 * (uint)obj->ds * (obj->dd + 1)) / 0x18;
              }
              wVar22 = wVar22 + iVar14;
              paVar18 = z_info;
            }
            lVar21 = lVar21 + 0x30;
          }
          break;
        case L'\a':
          goto switchD_001a1d5b_caseD_7;
        case L'\b':
switchD_001a1d5b_caseD_8:
          poVar8 = obj->kind;
          pcVar6 = poVar1->name;
          iVar14 = strcmp(pcVar6,"enhanced dice");
          if (iVar14 == 0) {
            iVar14 = (uint)obj->dd * ((uint)obj->ds - poVar8->ds);
            iVar14 = iVar14 * iVar14 * 0x10;
          }
          else {
            iVar14 = strcmp(pcVar6,"extra armor");
            if (iVar14 == 0) {
              iVar14 = (int)obj->ac - poVar8->ac;
            }
            else {
              iVar14 = strcmp(pcVar6,"armor bonus");
              if (iVar14 != 0) {
                iVar14 = strcmp(pcVar6,"skill bonus");
                if (iVar14 == 0) {
                  iVar14 = (int)obj->to_h - (poVar8->to_h).base;
                }
                else {
                  iVar14 = strcmp(pcVar6,"deadliness bonus");
                  if (iVar14 != 0) break;
                  iVar14 = (int)obj->to_d;
                }
                iVar11 = -iVar14;
                if (0 < iVar14) {
                  iVar11 = iVar14;
                }
                wVar13 = poVar1->price_square;
                wVar4 = poVar1->price_linear;
                wVar5 = poVar1->price_constant;
                _Var9 = tval_is_ammo(obj);
                iVar12 = 1;
                if (_Var9) {
                  iVar12 = 0x14;
                }
                iVar12 = ((iVar11 * wVar13 + wVar4) * iVar14 + wVar5) / iVar12;
                goto LAB_001a1dc4;
              }
              iVar14 = (int)obj->to_a;
            }
            iVar11 = -iVar14;
            if (0 < iVar14) {
              iVar11 = iVar14;
            }
            iVar14 = (iVar11 * poVar1->price_square + poVar1->price_linear) * iVar14;
            wVar22 = wVar22 + poVar1->price_constant;
          }
LAB_001a22ab:
          wVar22 = wVar22 + iVar14;
        }
        break;
      case L'\x03':
        _Var9 = flag_has_dbg(obj->flags,6,wVar4,"obj->flags","idx");
        if (_Var9) {
          wVar13 = poVar1->type;
          goto LAB_001a1d42;
        }
        break;
      case L'\x04':
        if (obj->el_info[wVar4].res_level != 100) {
switchD_001a1d5b_caseD_4:
          iVar12 = 100 - obj->el_info[wVar4].res_level;
          iVar14 = -iVar12;
          if (0 < iVar12) {
            iVar14 = iVar12;
          }
          iVar12 = (iVar14 * poVar1->price_square + poVar1->price_linear) * iVar12;
          wVar22 = wVar22 + poVar1->price_constant;
LAB_001a1dc4:
          wVar22 = wVar22 + iVar12;
        }
        break;
      case L'\x05':
        if ((obj->el_info[wVar4].flags & 2) != 0) {
switchD_001a1d5b_caseD_3:
          wVar22 = wVar22 + poVar1->price_constant;
        }
        break;
      case L'\x06':
        p_Var7 = obj->brands;
        if (p_Var7 != (_Bool *)0x0) {
          bVar2 = z_info->brand_max;
          for (uVar25 = 1; uVar25 < bVar2; uVar25 = uVar25 + 1) {
            if ((p_Var7[uVar25] == true) &&
               (poVar15 = brand_property((wchar_t)uVar25), poVar15 == poVar1))
            goto switchD_001a1d5b_caseD_6;
          }
        }
        break;
      case L'\a':
        if (obj->slays != (_Bool *)0x0) {
          bVar2 = z_info->slay_max;
          wVar13 = L'\x01';
          do {
            if ((uint)bVar2 <= (uint)wVar13) goto switchD_001a1d5b_default;
            poVar15 = slay_property(wVar13);
            wVar13 = wVar13 + L'\x01';
          } while (poVar15 != poVar1);
switchD_001a1d5b_caseD_7:
          paVar18 = z_info;
          for (uVar25 = 0; uVar25 < paVar18->slay_max; uVar25 = uVar25 + 1) {
            if ((obj->slays[uVar25] == true) &&
               (poVar15 = slay_property((wchar_t)uVar25), poVar1 == poVar15)) {
              iVar14 = slays[uVar25].multiplier;
              _Var9 = tval_is_ammo(obj);
              iVar11 = -iVar14;
              if (0 < iVar14) {
                iVar11 = iVar14;
              }
              local_54 = ((iVar11 * poVar1->price_square + poVar1->price_linear) * iVar14 +
                         poVar1->price_constant) / (int)((uint)_Var9 + (uint)_Var9 * 8 + 1);
              _Var10 = tval_is_melee_weapon(obj);
              paVar18 = z_info;
              if (_Var9 || _Var10) {
                local_54 = (int)(local_54 * (uint)obj->ds * (obj->dd + 1)) / 0x18;
              }
              p_Var7 = obj->brands;
              if (p_Var7 != (_Bool *)0x0) {
                pcVar6 = poVar1->name;
                iVar14 = strcmp(pcVar6,"slay evil creatures");
                if (iVar14 != 0) {
                  bVar2 = paVar18->brand_max;
                  ppcVar23 = &brands[1].name;
                  for (uVar20 = 1; uVar20 < bVar2; uVar20 = uVar20 + 1) {
                    if (p_Var7[uVar20] == true) {
                      pcVar17 = *ppcVar23;
                      pcVar16 = strstr(pcVar17,"poison brand");
                      if ((pcVar16 == (char *)0x0) &&
                         ((pcVar17 = strstr(pcVar17,"cold brand"), pcVar17 == (char *)0x0 ||
                          (iVar14 = strcmp(pcVar6,"slay undead"), iVar14 != 0)))) {
                        local_54 = local_54 + local_54 / -4;
                        break;
                      }
                    }
                    ppcVar23 = ppcVar23 + 6;
                  }
                }
              }
              wVar22 = wVar22 + local_54;
            }
          }
        }
        break;
      case L'\b':
        pcVar6 = poVar1->name;
        iVar14 = strcmp(pcVar6,"enhanced dice");
        if (iVar14 == 0) {
          if ((obj->kind->dd < (int)(uint)obj->dd) || (obj->kind->ds < (int)(uint)obj->ds))
          goto switchD_001a1d5b_caseD_8;
        }
        else {
          iVar14 = strcmp(pcVar6,"extra armor");
          if (iVar14 == 0) {
            if (obj->kind->ac < (int)obj->ac) goto switchD_001a1d5b_caseD_8;
          }
          else {
            iVar14 = strcmp(pcVar6,"armor bonus");
            if (iVar14 == 0) {
              sVar3 = obj->to_a;
            }
            else {
              iVar14 = strcmp(pcVar6,"skill bonus");
              if (iVar14 == 0) {
                sVar3 = obj->to_h;
              }
              else {
                iVar14 = strcmp(pcVar6,"deadliness bonus");
                if (iVar14 != 0) break;
                sVar3 = obj->to_d;
              }
            }
            if (sVar3 != 0) goto switchD_001a1d5b_caseD_8;
          }
        }
      }
switchD_001a1d5b_default:
    }
    if (obj->curses != (curse_data *)0x0) {
      lVar21 = 3;
      paVar18 = z_info;
      for (uVar24 = 0; uVar24 < paVar18->curse_max; uVar24 = uVar24 + 1) {
        if (obj->curses[uVar24].power != L'\0') {
          wVar13 = object_value_real(*(object **)(curses->conflict_flags + lVar21 * 8 + -0x28),
                                     L'\x01');
          wVar22 = wVar22 + wVar13;
          paVar18 = z_info;
        }
        lVar21 = lVar21 + 7;
      }
    }
  }
  else {
    if (obj->artifact == (artifact *)0x0) {
      pwVar19 = &obj->kind->cost;
    }
    else {
      pwVar19 = &obj->artifact->cost;
    }
    wVar22 = *pwVar19;
    if (wVar22 == L'\0') {
      wVar22 = L'\0';
    }
    else {
      wVar13 = wVar22 * qty;
      _Var9 = tval_can_have_charges(obj);
      if (_Var9) {
        iVar14 = obj->pval * qty;
        wVar13 = wVar13 + (((iVar14 / (int)(uint)obj->number + 1) -
                           (uint)(iVar14 % (int)(uint)obj->number == 0)) * wVar22) / 0x14;
      }
      wVar22 = L'\0';
      if (L'\0' < wVar13) {
        wVar22 = wVar13;
      }
    }
  }
  return wVar22;
}

Assistant:

int object_value_real(const struct object *obj, int qty)
{
	int value, total_value = 0;

	/* Wearables and ammo have prices that vary by individual item properties */
	if (tval_has_variable_power(obj)) {
		int i, j;

		/* Base cost */
		value = obj->kind->cost;

		/* Add/subtract value for properties */
		for (i = 1; i < z_info->property_max; i++) {
			struct obj_property *prop =	&obj_properties[i];
			int idx = prop->index;
			if (!object_has_property(obj, prop)) continue;
			switch (prop->type) {
				case OBJ_PROPERTY_STAT :
				case OBJ_PROPERTY_MOD :
				{
					value += property_cost(prop, obj->modifiers[idx], true);
					break;
				}
				case OBJ_PROPERTY_FLAG :
				{
					value += property_cost(prop, 0, true);
					break;
				}
				case OBJ_PROPERTY_ELEMENT :
				{
					int amount = RES_LEVEL_BASE - obj->el_info[idx].res_level;
					value += property_cost(prop, amount, true);
					break;
				}
				case OBJ_PROPERTY_IGNORE :
				{
					value += property_cost(prop, 0, true);
					break;
				}
				case OBJ_PROPERTY_BRAND :
				{
					for (j = 0; j < z_info->brand_max; j++) {
						if (obj->brands[j] && (prop == brand_property(j))) {
							int mult = brands[j].multiplier;
							int div = tval_is_ammo(obj) ? 10 : 1;
							int32_t bonus = property_cost(prop, mult, true) / div;
							/* Weapons with big dice are just better, so
							 * anything that enhances attacks is worth more on
							 them */
							if ((tval_is_melee_weapon(obj)) || (div == 10))	{
								bonus *= ((obj->dd + 1) * (obj->ds));
								bonus /= 24;
							}
							value += bonus;
						}
					}
					break;
				}
				case OBJ_PROPERTY_SLAY :
				{
					for (j = 0; j < z_info->slay_max; j++) {
						if (obj->slays[j] && (prop == slay_property(j))) {
							int mult = slays[j].multiplier;
							int div = tval_is_ammo(obj) ? 10 : 1;
							int32_t bonus = property_cost(prop, mult, true) / div;
							/* Weapons with big dice are just better, so
							 * anything that enhances attacks is worth more on
							 them */
							if ((tval_is_melee_weapon(obj)) || (div == 10))
							{
								bonus *= ((obj->dd + 1) * (obj->ds));
								bonus /= 24;
							}
							/* Cheap check for brands with broader applicability
							 * that might reduce the slay's practical value */
							if ((obj->brands) &&
								(!streq(prop->name, "slay evil creatures"))) {
								int k;
								bool reduce_bonus = false;
								for (k = 1; k < z_info->brand_max; k++)
								{
									if (!obj->brands[k]) continue;
									if (strstr(brands[k].name, "poison brand"))
										continue;
									if ((strstr(brands[k].name, "cold brand"))
										&& (streq(prop->name, "slay undead")))
										continue;
									reduce_bonus = true;
									break;
								}
								if (reduce_bonus) bonus -= (bonus / 4);
							}
							value += bonus;
						}
					}
					break;
				}
				case OBJ_PROPERTY_COMBAT :
				{
					struct object_kind *kind = obj->kind;
					if (streq(prop->name, "enhanced dice")) {
						value += (obj->ds - kind->ds) * (obj->ds - kind->ds)
							* obj->dd * obj->dd * 16L;
					} else if (streq(prop->name, "extra armor")) {
						value += property_cost(prop, obj->ac - kind->ac, true);
					} else if (streq(prop->name, "armor bonus")) {
						value += property_cost(prop, obj->to_a, true);
					} else if (streq(prop->name, "skill bonus")) {
						value += property_cost(prop, obj->to_h- kind->to_h.base,
											   true) /
							(tval_is_ammo(obj) ? 20 : 1);
					} else if (streq(prop->name, "deadliness bonus")) {
						value += property_cost(prop, obj->to_d, true) /
							(tval_is_ammo(obj) ? 20 : 1);
					}
					break;
				}
				default : break;
			}
		}

		/* Amend cost for curses */
		if (obj->curses) {
			for (i = 0; i < z_info->curse_max; i++) {
				if (obj->curses[i].power) {
					value += object_value_real(curses[i].obj, 1);
				}
			}
		}

		total_value = value;
	} else {
		/* Base cost */
		if (obj->artifact) {
			value = obj->artifact->cost;
		} else {
			value = obj->kind->cost;
		}

		/* Worthless items */
		if (!value) return (0L);

		/* Account for quantity */
		total_value = value * qty;

		/* Charge-holding devices need special treatment */
		if (tval_can_have_charges(obj)) {
			int charges;

			/* Calculate number of charges, rounded up */
			charges = obj->pval * qty / obj->number;
			if ((obj->pval * qty) % obj->number != 0)
				charges++;

			/* Pay extra for charges, depending on standard number of charges */
			total_value += value * charges / 20;
		}

		/* No negative value */
		if (total_value < 0) total_value = 0;
	}

	/* Return the value */
	return total_value;
}